

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator * __thiscall
QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>::erase
          (iterator *__return_storage_ptr__,
          QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*> *this,
          const_iterator it)

{
  Span *pSVar1;
  Chain *pCVar2;
  MultiNodeChain<QPersistentModelIndexData_*> *pMVar3;
  Span *pSVar4;
  Data *pDVar5;
  ulong uVar6;
  long lVar7;
  undefined1 *puVar8;
  Chain **ppCVar9;
  uint uVar10;
  uchar *puVar12;
  long in_FS_OFFSET;
  Bucket bucket;
  iterator local_48;
  long local_30;
  ulong uVar11;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
  local_48.i.d = (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                  *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  detach(&local_48,this,it);
  ppCVar9 = local_48.e;
  __return_storage_ptr__->e = local_48.e;
  (__return_storage_ptr__->i).d = local_48.i.d;
  (__return_storage_ptr__->i).bucket = local_48.i.bucket;
  pCVar2 = *local_48.e;
  pMVar3 = pCVar2->next;
  *local_48.e = pMVar3;
  if (pCVar2 != (Chain *)0x0) {
    operator_delete(pCVar2,0x10);
  }
  if (pMVar3 != (MultiNodeChain<QPersistentModelIndexData_*> *)0x0) goto LAB_0045d1d5;
  uVar11 = (__return_storage_ptr__->i).bucket;
  pSVar4 = ((__return_storage_ptr__->i).d)->spans;
  uVar6 = uVar11 >> 7;
  pSVar1 = pSVar4 + uVar6;
  uVar10 = (uint)uVar11 & 0x7f;
  uVar11 = (ulong)uVar10;
  if (ppCVar9 == (Chain **)&pSVar4[uVar6].entries[pSVar1->offsets[uVar11]].storage.field_0x18) {
    bucket.index._0_4_ = uVar10;
    bucket.span = pSVar1;
    bucket.index._4_4_ = 0;
    QHashPrivate::
    Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>::
    erase(this->d,bucket);
    pDVar5 = this->d;
    pSVar4 = pDVar5->spans;
    lVar7 = (long)pSVar1 - (long)pSVar4 >> 4;
    puVar8 = (undefined1 *)(lVar7 * 0x1c71c71c71c71c80 | uVar11);
    if ((puVar8 == (undefined1 *)(pDVar5->numBuckets - 1)) || (pSVar1->offsets[uVar11] == 0xff)) {
      do {
        local_48.i.bucket = local_48.i.bucket + 1;
        if ((undefined1 *)(local_48.i.d)->numBuckets == (undefined1 *)local_48.i.bucket)
        goto LAB_0045d173;
      } while ((local_48.i.d)->spans[local_48.i.bucket >> 7].offsets[(uint)local_48.i.bucket & 0x7f]
               == 0xff);
      goto LAB_0045d17b;
    }
    if (pDVar5 != (Data *)0x0) {
      uVar6 = lVar7 * -0x71c71c71c71c71c7 & 0x1ffffffffffffff;
      pSVar1 = pSVar4 + uVar6;
      puVar12 = pSVar4[uVar6].offsets + uVar11;
      goto LAB_0045d1b5;
    }
LAB_0045d1c8:
    ppCVar9 = (Chain **)0x0;
  }
  else {
    do {
      local_48.i.bucket = local_48.i.bucket + 1;
      if ((undefined1 *)(local_48.i.d)->numBuckets == (undefined1 *)local_48.i.bucket)
      goto LAB_0045d173;
    } while ((local_48.i.d)->spans[local_48.i.bucket >> 7].offsets[(uint)local_48.i.bucket & 0x7f]
             == 0xff);
LAB_0045d17b:
    pDVar5 = local_48.i.d;
    puVar8 = (undefined1 *)local_48.i.bucket;
    if (local_48.i.d == (Data *)0x0) goto LAB_0045d1c8;
    pSVar1 = (local_48.i.d)->spans + (local_48.i.bucket >> 7);
    puVar12 = (local_48.i.d)->spans[local_48.i.bucket >> 7].offsets +
              ((uint)local_48.i.bucket & 0x7f);
LAB_0045d1b5:
    ppCVar9 = (Chain **)&pSVar1->entries[*puVar12].storage.field_0x18;
  }
  (__return_storage_ptr__->i).d = pDVar5;
  (__return_storage_ptr__->i).bucket = (size_t)puVar8;
  __return_storage_ptr__->e = ppCVar9;
LAB_0045d1d5:
  this->m_size = this->m_size + -1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
LAB_0045d173:
  local_48.i.d = (Data *)0x0;
  local_48.i.bucket = 0;
  goto LAB_0045d17b;
}

Assistant:

iterator erase(const_iterator it)
    {
        Q_ASSERT(d);
        iterator iter = detach(it);
        iterator i = iter;
        Chain *e = *i.e;
        Chain *next = e->next;
        *i.e = next;
        delete e;
        if (!next) {
            if (i.e == &i.i.node()->value) {
                // last remaining entry, erase
                typename Data::Bucket bucket(i.i);
                d->erase(bucket);
                if (bucket.toBucketIndex(d) == d->numBuckets - 1 || bucket.isUnused())
                    i = iterator(++iter.i);
                else // 'i' currently has a nullptr chain. So, we must recreate it
                    i = iterator(bucket.toIterator(d));
            } else {
                i = iterator(++iter.i);
            }
        }
        --m_size;
        Q_ASSERT(m_size >= 0);
        return i;
    }